

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QConfFileSettingsPrivate::clear(QConfFileSettingsPrivate *this)

{
  QConfFile *confFile;
  
  if ((this->confFiles).d.size != 0) {
    confFile = *(this->confFiles).d.ptr;
    QBasicMutex::lock(&(confFile->mutex).super_QBasicMutex);
    ensureAllSectionsParsed(this,confFile);
    QMap<QSettingsKey,_QVariant>::clear(&confFile->addedKeys);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QVariant,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QVariant>_>_>_>_>
    ::operator=(&(confFile->removedKeys).d,&(confFile->originalKeys).d);
    QBasicMutex::unlock(&(confFile->mutex).super_QBasicMutex);
    return;
  }
  return;
}

Assistant:

constexpr bool isEmpty() const noexcept { return size() == 0; }